

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O0

void test_skiplist_delete_nonexist_single(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  undefined4 local_64;
  char cStack_60;
  int fake_key;
  ion_status_t status;
  ion_byte_t value [10];
  int key;
  ion_skiplist_t skiplist;
  planck_unit_test_t *tc_local;
  
  initialize_skiplist_std_conditions((ion_skiplist_t *)(value + 6));
  value[2] = '\x10';
  value[3] = '\0';
  value[4] = '\0';
  value[5] = '\0';
  strcpy(&status.field_0x2,"Delete me");
  _cStack_60 = sl_insert((ion_skiplist_t *)(value + 6),value + 2,&status.field_0x2);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(cStack_60 == '\0'),0x377,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(fake_key == 1),0x378,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  local_64 = 0x21;
  _cStack_60 = sl_delete((ion_skiplist_t *)(value + 6),&local_64);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(cStack_60 == '\x01'),0x382,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(fake_key == 0),899,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  sl_destroy((ion_skiplist_t *)(value + 6));
  return;
}

Assistant:

void
test_skiplist_delete_nonexist_single(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	int			key = 16;
	ion_byte_t	value[10];

	strcpy((char *) value, "Delete me");

	ion_status_t status = sl_insert(&skiplist, (ion_key_t) &key, value);

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

	int fake_key = 33;

	status = sl_delete(&skiplist, (ion_key_t) &fake_key);

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	PLANCK_UNIT_ASSERT_TRUE(tc, err_item_not_found == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == status.count);

	sl_destroy(&skiplist);
}